

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O3

int64_t __thiscall
aeron::archive::AeronArchive::pollForResponse(AeronArchive *this,int64_t correlationId)

{
  char *pcVar1;
  element_type *peVar2;
  ClientConductor *this_00;
  Value __val;
  long lVar3;
  int64_t iVar4;
  long *plVar5;
  string *__rhs;
  SourcedException *pSVar6;
  char *pcVar7;
  size_type *psVar8;
  char *pcVar9;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  deadline;
  allocator local_159;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  TimePoint local_38;
  
  lVar3 = std::chrono::_V2::system_clock::now();
  local_38.__d.__r = (duration)(lVar3 + (this->messageTimeoutNs_).__r);
  do {
    while( true ) {
      pollNextResponse(this,correlationId,&local_38);
      iVar4 = ControlResponsePoller::controlSessionId
                        ((this->controlResponsePoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                         _M_head_impl);
      if (iVar4 == this->controlSessionId_) break;
LAB_00132425:
      peVar2 = (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2->m_conductorInvoker).m_isRunning == true) {
        this_00 = (peVar2->m_conductorInvoker).m_agent;
        DriverListenerAdapter<aeron::ClientConductor>::receiveMessages
                  (&this_00->m_driverListenerAdapter);
        ClientConductor::onHeartbeatCheckTimeouts(this_00);
      }
    }
    iVar4 = ControlResponsePoller::templateId
                      ((this->controlResponsePoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                       _M_head_impl);
    if (iVar4 != 1) goto LAB_00132425;
    __val = ControlResponsePoller::code
                      ((this->controlResponsePoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                       _M_head_impl);
    if (__val == ERROR) {
      pSVar6 = (SourcedException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_d8,correlationId);
      std::operator+(&local_98,"response for correlation id: ",&local_d8);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
      local_138._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_138._M_dataplus._M_p == psVar8) {
        local_138.field_2._M_allocated_capacity = *psVar8;
        local_138.field_2._8_8_ = plVar5[3];
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar8;
      }
      local_138._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      __rhs = ControlResponsePoller::errorMessage_abi_cxx11_
                        ((this->controlResponsePoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                         _M_head_impl);
      std::operator+(&local_118,&local_138,__rhs);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_118);
      local_158._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_158._M_dataplus._M_p == psVar8) {
        local_158.field_2._M_allocated_capacity = *psVar8;
        local_158.field_2._8_8_ = plVar5[3];
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      }
      else {
        local_158.field_2._M_allocated_capacity = *psVar8;
      }
      local_158._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      iVar4 = ControlResponsePoller::relevantId
                        ((this->controlResponsePoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                         _M_head_impl);
      std::__cxx11::to_string(&local_58,iVar4);
      std::operator+(&local_f8,&local_158,&local_58);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,
                 "std::int64_t aeron::archive::AeronArchive::pollForResponse(std::int64_t)","");
      pcVar9 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
      ;
      pcVar7 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
      do {
        pcVar7 = pcVar7 + 1;
        pcVar1 = pcVar9 + 1;
        pcVar9 = pcVar9 + 1;
      } while (*pcVar7 == *pcVar1);
      std::__cxx11::string::string((string *)&local_78,pcVar9 + (*pcVar1 == '/'),&local_159);
      aeron::util::SourcedException::SourcedException(pSVar6,&local_f8,&local_b8,&local_78,0x170);
      *(undefined ***)pSVar6 = &PTR__SourcedException_001642b8;
      __cxa_throw(pSVar6,&ArchiveException::typeinfo,
                  aeron::util::SourcedException::~SourcedException);
    }
    iVar4 = ControlResponsePoller::correlationId
                      ((this->controlResponsePoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                       _M_head_impl);
    if (iVar4 == correlationId) {
      if (__val == OK) {
        iVar4 = ControlResponsePoller::relevantId
                          ((this->controlResponsePoller_)._M_t.
                           super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                           .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                           _M_head_impl);
        return iVar4;
      }
      pSVar6 = (SourcedException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_158,__val);
      std::operator+(&local_f8,"unexpected response: code=",&local_158);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,
                 "std::int64_t aeron::archive::AeronArchive::pollForResponse(std::int64_t)","");
      pcVar9 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
      ;
      pcVar7 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
      do {
        pcVar7 = pcVar7 + 1;
        pcVar1 = pcVar9 + 1;
        pcVar9 = pcVar9 + 1;
      } while (*pcVar7 == *pcVar1);
      std::__cxx11::string::string
                ((string *)&local_138,pcVar9 + (*pcVar1 == '/'),(allocator *)&local_98);
      aeron::util::SourcedException::SourcedException(pSVar6,&local_f8,&local_118,&local_138,0x173);
      *(undefined ***)pSVar6 = &PTR__SourcedException_001642b8;
      __cxa_throw(pSVar6,&ArchiveException::typeinfo,
                  aeron::util::SourcedException::~SourcedException);
    }
  } while( true );
}

Assistant:

std::int64_t AeronArchive::pollForResponse(std::int64_t correlationId) {
    auto deadline = Clock::now() + messageTimeoutNs_;

    while (true) {
        pollNextResponse(correlationId, deadline);

        if (controlResponsePoller_->controlSessionId() != controlSessionId_ ||
            controlResponsePoller_->templateId() != codecs::ControlResponse::sbeTemplateId()) {
            aeron_->conductorAgentInvoker().invoke();
            continue;
        }

        auto code = controlResponsePoller_->code();
        if (code == codecs::ControlResponseCode::ERROR) {
            throw ArchiveException("response for correlation id: " + std::to_string(correlationId) +
                                       ", error: " + controlResponsePoller_->errorMessage() +
                                       ", relevant id: " + std::to_string(controlResponsePoller_->relevantId()),
                                   SOURCEINFO);
        } else if (correlationId == controlResponsePoller_->correlationId()) {
            if (code != codecs::ControlResponseCode::OK) {
                throw ArchiveException("unexpected response: code=" + std::to_string(code), SOURCEINFO);
            }

            return controlResponsePoller_->relevantId();
        }
    }
}